

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_appender.cpp
# Opt level: O2

void AssertDecimalValueMatches
               (unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true>
                *result,duckdb_decimal expected)

{
  pointer this;
  SourceLineInfo local_110;
  BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> local_100;
  AssertionHandler catchAssertionHandler;
  duckdb_decimal local_88;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  this = duckdb::unique_ptr<duckdb::CAPIResult,_std::default_delete<duckdb::CAPIResult>,_true>::
         operator->(result);
  duckdb::CAPIResult::Fetch<duckdb_decimal>(&local_88,this,0,0);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x438f58;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2b;
  Catch::StringRef::StringRef(&local_40,"actual.scale == expected.scale");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,&local_110,local_40,Normal);
  local_110.file = (char *)&local_88.scale;
  Catch::ExprLhs<unsigned_char_const&>::operator==
            ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)&local_100,
             (ExprLhs<unsigned_char_const&> *)&local_110,&expected.scale);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x438f58;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2c;
  Catch::StringRef::StringRef(&local_50,"actual.width == expected.width");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,&local_110,local_50,Normal);
  local_110.file = (char *)&local_88;
  Catch::ExprLhs<unsigned_char_const&>::operator==
            ((BinaryExpr<const_unsigned_char_&,_const_unsigned_char_&> *)&local_100,
             (ExprLhs<unsigned_char_const&> *)&local_110,&expected.width);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x438f58;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2d;
  Catch::StringRef::StringRef(&local_60,"actual.value.lower == expected.value.lower");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,&local_110,local_60,Normal);
  local_110.file = (char *)&local_88.value;
  Catch::ExprLhs<unsigned_long_const&>::operator==
            (&local_100,(ExprLhs<unsigned_long_const&> *)&local_110,&expected.value.lower);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_100.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x438f58;
  local_100.super_ITransientExpression.m_isBinaryExpression = true;
  local_100.super_ITransientExpression.m_result = false;
  local_100.super_ITransientExpression._10_6_ = 0;
  local_110.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_110.line = 0x2e;
  Catch::StringRef::StringRef(&local_70,"actual.value.upper == expected.value.upper");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_100,&local_110,local_70,Normal);
  local_110.file = (char *)&local_88.value.upper;
  Catch::ExprLhs<long_const&>::operator==
            ((BinaryExpr<const_long_&,_const_long_&> *)&local_100,(ExprLhs<long_const&> *)&local_110
             ,&expected.value.upper);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_100.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void AssertDecimalValueMatches(duckdb::unique_ptr<CAPIResult> &result, duckdb_decimal expected) {
	duckdb_decimal actual;

	actual = result->Fetch<duckdb_decimal>(0, 0);
	REQUIRE(actual.scale == expected.scale);
	REQUIRE(actual.width == expected.width);
	REQUIRE(actual.value.lower == expected.value.lower);
	REQUIRE(actual.value.upper == expected.value.upper);
}